

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

float lda_loop(lda *l,v_array<float> *Elogtheta,float *v,example *ec,float param_5)

{
  byte bVar1;
  vw *pvVar2;
  float *pfVar3;
  size_t sVar4;
  size_t sVar5;
  weight *pwVar6;
  long lVar7;
  size_t sVar8;
  byte *pbVar9;
  float *pfVar10;
  ulong uVar11;
  features *pfVar12;
  ulong *puVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  example *__range2;
  float local_60;
  float local_5c;
  v_array<float> *local_58;
  features *local_50;
  byte *local_48;
  byte *local_40;
  sparse_parameters *local_38;
  
  pvVar2 = l->all;
  local_58 = Elogtheta;
  v_array<float>::clear((v_array<float> *)&(anonymous_namespace)::new_gamma);
  v_array<float>::clear((v_array<float> *)&(anonymous_namespace)::old_gamma);
  if (l->topics != 0) {
    uVar11 = 0;
    do {
      local_5c = 1.0;
      v_array<float>::push_back((v_array<float> *)&(anonymous_namespace)::new_gamma,&local_5c);
      local_60 = 0.0;
      v_array<float>::push_back((v_array<float> *)&(anonymous_namespace)::old_gamma,&local_60);
      uVar11 = uVar11 + 1;
    } while (uVar11 < l->topics);
  }
  pfVar12 = (ec->super_example_predict).feature_space;
  local_38 = &(pvVar2->weights).sparse_weights;
  local_50 = pfVar12;
  do {
    memcpy(v,(anonymous_namespace)::new_gamma,l->topics << 2);
    lda::expdigammify(l,l->all,v);
    memcpy((anonymous_namespace)::old_gamma,(anonymous_namespace)::new_gamma,l->topics << 2);
    memset((anonymous_namespace)::new_gamma,0,l->topics << 2);
    pbVar9 = (ec->super_example_predict).indices._begin;
    local_48 = (ec->super_example_predict).indices._end;
    if (pbVar9 == local_48) {
      fVar17 = 0.0;
      fVar18 = 0.0;
    }
    else {
      fVar18 = 0.0;
      fVar17 = 0.0;
      do {
        bVar1 = *pbVar9;
        pfVar10 = pfVar12[bVar1].values._begin;
        pfVar3 = pfVar12[bVar1].values._end;
        local_40 = pbVar9;
        if (pfVar10 != pfVar3) {
          puVar13 = pfVar12[bVar1].indicies._begin;
          do {
            if ((pvVar2->weights).sparse == true) {
              pwVar6 = sparse_parameters::operator[](local_38,*puVar13);
            }
            else {
              pwVar6 = (pvVar2->weights).dense_weights._begin +
                       (*puVar13 & (pvVar2->weights).dense_weights._weight_mask);
            }
            sVar4 = l->topics;
            if (sVar4 == 0) {
              fVar14 = 0.0;
            }
            else {
              fVar14 = 0.0;
              lVar7 = 0;
              do {
                fVar14 = fVar14 + *(float *)((long)pwVar6 + lVar7 + sVar4 * 4 + 4) *
                                  *(float *)((long)v + lVar7);
                lVar7 = lVar7 + 4;
              } while (lVar7 != sVar4 * 4);
            }
            fVar16 = *pfVar10;
            fVar15 = logf(1.0 / fVar14);
            sVar5 = l->topics;
            if (sVar5 != 0) {
              sVar8 = 0;
              do {
                (anonymous_namespace)::new_gamma[sVar8] =
                     pwVar6[sVar4 + sVar8 + 1] * (1.0 / fVar14) * fVar16 +
                     (anonymous_namespace)::new_gamma[sVar8];
                sVar8 = sVar8 + 1;
              } while (sVar5 != sVar8);
            }
            fVar17 = fVar17 + *pfVar10;
            fVar18 = fVar18 - fVar16 * fVar15;
            pfVar10 = pfVar10 + 1;
            puVar13 = puVar13 + 1;
          } while (pfVar10 != pfVar3);
        }
        pbVar9 = local_40 + 1;
        pfVar12 = local_50;
      } while (pbVar9 != local_48);
    }
    if (l->topics != 0) {
      uVar11 = 0;
      do {
        (anonymous_namespace)::new_gamma[uVar11] =
             (anonymous_namespace)::new_gamma[uVar11] * v[uVar11] + l->lda_alpha;
        uVar11 = uVar11 + 1;
      } while (uVar11 < l->topics);
    }
    uVar11 = (ulong)l->all->lda;
    fVar16 = 0.0;
    fVar14 = 0.0;
    if (uVar11 != 0) {
      lVar7 = 0;
      do {
        fVar14 = fVar14 + ABS(*(float *)((long)(anonymous_namespace)::old_gamma + lVar7) -
                              *(float *)((long)(anonymous_namespace)::new_gamma + lVar7));
        lVar7 = lVar7 + 4;
      } while (uVar11 * 4 - lVar7 != 0);
    }
    if (uVar11 != 0) {
      fVar16 = 0.0;
      lVar7 = 0;
      do {
        fVar16 = fVar16 + *(float *)((long)(anonymous_namespace)::new_gamma + lVar7);
        lVar7 = lVar7 + 4;
      } while (uVar11 << 2 != lVar7);
    }
  } while (l->lda_epsilon <= fVar14 / fVar16 && fVar14 / fVar16 != l->lda_epsilon);
  v_array<float>::clear(&(ec->pred).scalars);
  v_array<float>::resize(&(ec->pred).scalars,l->topics);
  memcpy((ec->pred).scalars._begin,(anonymous_namespace)::new_gamma,l->topics << 2);
  (ec->pred).scalars._end = (ec->pred).scalars._begin + l->topics;
  fVar14 = theta_kl(l,local_58,(anonymous_namespace)::new_gamma);
  return (fVar14 + fVar18) / fVar17;
}

Assistant:

float lda_loop(lda &l, v_array<float> &Elogtheta, float *v, example *ec, float)
{
  parameters &weights = l.all->weights;
  new_gamma.clear();
  old_gamma.clear();

  for (size_t i = 0; i < l.topics; i++)
  {
    new_gamma.push_back(1.f);
    old_gamma.push_back(0.f);
  }
  size_t num_words = 0;
  for (features &fs : *ec) num_words += fs.size();

  float xc_w = 0;
  float score = 0;
  float doc_length = 0;
  do
  {
    memcpy(v, new_gamma.begin(), sizeof(float) * l.topics);
    l.expdigammify(*l.all, v);

    memcpy(old_gamma.begin(), new_gamma.begin(), sizeof(float) * l.topics);
    memset(new_gamma.begin(), 0, sizeof(float) * l.topics);

    score = 0;
    size_t word_count = 0;
    doc_length = 0;
    for (features &fs : *ec)
    {
      for (features::iterator &f : fs)
      {
        float *u_for_w = &(weights[f.index()]) + l.topics + 1;
        float c_w = find_cw(l, u_for_w, v);
        xc_w = c_w * f.value();
        score += -f.value() * log(c_w);
        size_t max_k = l.topics;
        for (size_t k = 0; k < max_k; k++, ++u_for_w) new_gamma[k] += xc_w * *u_for_w;
        word_count++;
        doc_length += f.value();
      }
    }
    for (size_t k = 0; k < l.topics; k++) new_gamma[k] = new_gamma[k] * v[k] + l.lda_alpha;
  } while (average_diff(*l.all, old_gamma.begin(), new_gamma.begin()) > l.lda_epsilon);

  ec->pred.scalars.clear();
  ec->pred.scalars.resize(l.topics);
  memcpy(ec->pred.scalars.begin(), new_gamma.begin(), l.topics * sizeof(float));
  ec->pred.scalars.end() = ec->pred.scalars.begin() + l.topics;

  score += theta_kl(l, Elogtheta, new_gamma.begin());

  return score / doc_length;
}